

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution_x86_avx::create_pipeline_int8_x86(Convolution_x86_avx *this,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined4 kernel_w;
  undefined4 kernel_h;
  float *pfVar9;
  int *piVar10;
  Allocator *pAVar11;
  int max_kk;
  Option *pOVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  Mat *pMVar17;
  long lVar18;
  undefined1 *puVar19;
  undefined1 *puVar20;
  int iVar21;
  ulong uVar22;
  uint uVar23;
  long lVar24;
  int iVar25;
  Mat *pMVar26;
  long lVar27;
  int iVar28;
  uint uVar29;
  long lVar30;
  int k;
  uint uVar31;
  uint uVar32;
  size_t sVar33;
  long lVar34;
  int kk;
  ulong uVar35;
  undefined1 *puVar36;
  uint uVar37;
  void *pvVar38;
  void *pvVar39;
  char *pcVar40;
  int i;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  int iVar47;
  ulong uVar48;
  long lVar49;
  ulong uVar50;
  Mat *pMVar51;
  undefined1 auVar52 [16];
  float fVar53;
  int TILE_M;
  int TILE_K;
  int TILE_N;
  uint local_200;
  ulong local_1e8;
  long local_1e0;
  long local_1d0;
  uint local_1c4;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  Mat *local_1a8;
  undefined4 local_19c;
  Mat local_198;
  Option *local_148;
  Mat *local_140;
  ulong local_138;
  ulong local_130;
  long local_128;
  long local_120;
  ulong local_118;
  long local_110;
  ulong local_108;
  int local_fc;
  Mat local_f8;
  long local_b0;
  long local_a8;
  undefined8 local_a0;
  uint local_94;
  int local_90;
  int local_8c;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  
  kernel_w = (this->super_Convolution).kernel_w;
  kernel_h = (this->super_Convolution).kernel_h;
  auVar52._4_4_ = kernel_h;
  auVar52._0_4_ = kernel_w;
  uVar31 = kernel_h * kernel_w;
  uVar22 = (ulong)uVar31;
  uVar45 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar31;
  uVar29 = (this->super_Convolution).num_output;
  uVar48 = (ulong)uVar29;
  uVar45 = (long)((ulong)(uint)((int)uVar45 >> 0x1f) << 0x20 | uVar45 & 0xffffffff) /
           (long)(int)uVar29;
  uVar43 = uVar45 & 0xffffffff;
  local_200 = (uint)uVar45;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar13 = false;
  }
  else {
    bVar13 = 8 < (int)uVar29 || 8 < (int)local_200;
  }
  auVar2._0_4_ = (this->super_Convolution).dilation_w;
  auVar2._4_4_ = (this->super_Convolution).dilation_h;
  auVar2._8_4_ = (this->super_Convolution).stride_w;
  auVar2._12_4_ = (this->super_Convolution).stride_h;
  auVar52._8_8_ = 0;
  auVar52 = vpunpcklqdq_avx(auVar52,auVar2);
  local_140 = &(this->super_Convolution).weight_data;
  local_148 = opt;
  if ((((auVar52 == _DAT_005b2480) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar13)))) {
    bVar13 = opt->use_winograd43_convolution;
    iVar14 = cpu_support_x86_avx2();
    pOVar12 = local_148;
    if (bVar13 == true) {
      if (iVar14 != 0) {
        conv3x3s1_winograd43_transform_kernel_int8_avx2
                  (local_140,&this->weight_winograd43_data,local_200,uVar29,local_148);
        goto LAB_00208d5f;
      }
      get_optimal_tile_mnk_int8
                (uVar29,0,local_200,(int *)&local_1c4,&local_fc,&local_19c,local_148->num_threads);
      local_138 = (ulong)local_1c4;
      uVar45 = (long)(int)(local_1c4 + uVar29 + -1) / (long)(int)local_1c4;
      uVar43 = (ulong)local_19c;
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      Mat::create(&local_f8,local_19c * local_1c4 * 0x24,1,pOVar12->num_threads,4,(Allocator *)0x0);
      iVar14 = (int)uVar45;
      Mat::create(&this->weight_winograd43_data,local_19c * local_1c4,0x24,
                  (int)(local_200 + local_19c + -1) / local_19c,iVar14,4,(Allocator *)0x0);
      if (0 < iVar14) {
        local_1c0 = (ulong)(int)local_200;
        local_1b8 = 0;
        local_1b0 = uVar43;
        do {
          iVar14 = get_omp_thread_num();
          if (0 < (int)local_200) {
            iVar21 = (int)local_1b8 * (int)local_138;
            local_1a8 = (Mat *)((long)iVar14 * local_f8.cstep * local_f8.elemsize +
                               (long)local_f8.data);
            uVar31 = uVar29 - iVar21;
            uVar48 = (ulong)uVar31;
            if ((int)local_138 < (int)uVar31) {
              uVar48 = local_138 & 0xffffffff;
            }
            uVar50 = 0;
            uVar22 = uVar43;
            do {
              uVar43 = local_1b0;
              uVar31 = local_200 - (int)uVar50;
              if ((int)(uint)uVar22 < (int)uVar31) {
                uVar31 = (uint)uVar22;
              }
              if (0 < (int)uVar48) {
                pvVar38 = local_140->data;
                uVar22 = 0;
                pMVar51 = local_1a8;
                do {
                  if (0 < (int)uVar31) {
                    uVar35 = 0;
                    do {
                      pcVar40 = (char *)((long)pvVar38 +
                                        (uVar35 + uVar50) * 9 +
                                        (long)(int)((iVar21 + (int)uVar22) * local_200 * 9));
                      lVar18 = 0;
                      do {
                        cVar3 = *pcVar40;
                        cVar4 = pcVar40[1];
                        cVar5 = pcVar40[2];
                        *(short *)((long)&local_198.data + lVar18 * 2) = cVar3 * 6;
                        *(short *)((long)&local_198.data + lVar18 * 2 + 6) =
                             -(cVar5 * 4 + cVar4 * 4 + cVar3 * 4);
                        *(short *)((long)&local_198.refcount + lVar18 * 2 + 4) =
                             cVar4 * 4 + cVar3 * -4 + cVar5 * -4;
                        *(short *)((long)&local_198.elemsize + lVar18 * 2 + 2) =
                             (short)cVar3 + cVar4 * 2 + cVar5 * 4;
                        *(short *)((long)&local_198.elempack + lVar18 * 2) =
                             ((short)cVar3 - ((short)cVar4 + (short)cVar4)) + cVar5 * 4;
                        *(short *)(&local_198.field_0x1e + lVar18 * 2) = cVar5 * 6;
                        pcVar40 = pcVar40 + 3;
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 3);
                      lVar18 = 4;
                      do {
                        sVar6 = *(short *)((long)&local_19c + lVar18);
                        sVar7 = *(short *)((long)&local_19c + lVar18 + 2);
                        sVar8 = *(short *)((long)&local_198.data + lVar18);
                        *(short *)&pMVar51->data = sVar6 * 6;
                        *(short *)((long)&pMVar51->data + 2) = -(sVar8 * 4 + sVar7 * 4 + sVar6 * 4);
                        *(short *)((long)&pMVar51->data + 4) = sVar7 * 4 + sVar6 * -4 + sVar8 * -4;
                        *(short *)((long)&pMVar51->data + 6) = sVar6 + sVar7 * 2 + sVar8 * 4;
                        *(short *)&pMVar51->refcount = sVar6 + sVar7 * -2 + sVar8 * 4;
                        *(short *)((long)&pMVar51->refcount + 2) = sVar8 * 6;
                        pMVar51 = (Mat *)((long)&pMVar51->refcount + 4);
                        lVar18 = lVar18 + 6;
                      } while (lVar18 != 0x28);
                      uVar35 = uVar35 + 1;
                    } while (uVar35 != uVar31);
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != uVar48);
              }
              local_198.w = (this->weight_winograd43_data).w;
              local_198.elemsize = (this->weight_winograd43_data).elemsize;
              local_198.h = (this->weight_winograd43_data).h;
              local_198.elempack = (this->weight_winograd43_data).elempack;
              local_198.allocator = (this->weight_winograd43_data).allocator;
              local_198.cstep = (long)local_198.h * (long)local_198.w;
              local_198.data =
                   (void *)((long)(this->weight_winograd43_data).data +
                           local_198.elemsize * local_198.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar50 >> 0x1f) << 0x20 |
                                             uVar50 & 0xffffffff) / (long)(int)local_1b0) +
                           (this->weight_winograd43_data).cstep * local_1b8 * local_198.elemsize);
              local_198.refcount = (int *)0x0;
              local_198.dims = 2;
              local_198.d = 1;
              local_198.c = 1;
              pack_A_tile_int8(local_1a8,&local_198,0x24,(int)uVar48,uVar31);
              uVar50 = uVar50 + uVar43;
              uVar22 = uVar43;
            } while ((long)uVar50 < (long)local_1c0);
          }
          local_1b8 = local_1b8 + 1;
        } while (local_1b8 != (uVar45 & 0xffffffff));
      }
      piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar10 == (int *)0x0) goto LAB_00208d5f;
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 != 0) goto LAB_00208d5f;
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        goto LAB_00208d5f;
      }
    }
    else {
      if (iVar14 != 0) {
        conv3x3s1_winograd23_transform_kernel_int8_avx2
                  (local_140,&this->weight_winograd23_data,local_200,uVar29,local_148);
        goto LAB_00208d5f;
      }
      get_optimal_tile_mnk_int8
                (uVar29,0,local_200,(int *)&local_1c4,&local_fc,&local_19c,local_148->num_threads);
      local_1c0 = (ulong)local_1c4;
      uVar45 = (long)(int)(local_1c4 + uVar29 + -1) / (long)(int)local_1c4;
      pMVar51 = (Mat *)(long)local_19c;
      local_f8.cstep = 0;
      local_f8.data = (void *)0x0;
      local_f8.refcount._0_4_ = 0;
      local_f8.refcount._4_4_ = 0;
      local_f8.elemsize = 0;
      local_f8.elempack = 0;
      local_f8.allocator = (Allocator *)0x0;
      local_f8.dims = 0;
      local_f8.w = 0;
      local_f8.h = 0;
      local_f8.d = 0;
      local_f8.c = 0;
      Mat::create(&local_f8,local_19c * local_1c4 * 0x10,1,pOVar12->num_threads,2,(Allocator *)0x0);
      iVar14 = (int)uVar45;
      Mat::create(&this->weight_winograd23_data,local_19c * local_1c4,0x10,
                  (int)(local_200 + local_19c + -1) / local_19c,iVar14,2,(Allocator *)0x0);
      if (0 < iVar14) {
        local_1b8 = (ulong)(int)local_200;
        local_1b0 = uVar45 & 0xffffffff;
        local_1e8 = 0;
        local_1a8 = pMVar51;
        do {
          iVar14 = get_omp_thread_num();
          if (0 < (int)local_200) {
            iVar21 = (int)local_1e8 * (int)local_1c0;
            pMVar17 = (Mat *)((long)iVar14 * local_f8.cstep * local_f8.elemsize +
                             (long)local_f8.data);
            uVar31 = uVar29 - iVar21;
            uVar45 = (ulong)uVar31;
            if ((int)local_1c0 < (int)uVar31) {
              uVar45 = local_1c0 & 0xffffffff;
            }
            uVar43 = 0;
            pMVar26 = pMVar51;
            do {
              pMVar51 = local_1a8;
              uVar31 = local_200 - (int)uVar43;
              uVar48 = (ulong)uVar31;
              if ((int)pMVar26 < (int)uVar31) {
                uVar48 = (ulong)pMVar26 & 0xffffffff;
              }
              if (0 < (int)uVar45) {
                pvVar38 = local_140->data;
                uVar22 = 0;
                pMVar26 = pMVar17;
                do {
                  if (0 < (int)uVar48) {
                    uVar50 = 0;
                    do {
                      pcVar40 = (char *)((long)pvVar38 +
                                        (uVar50 + uVar43) * 9 +
                                        (long)(int)((iVar21 + (int)uVar22) * local_200 * 9));
                      lVar18 = 0;
                      do {
                        cVar3 = *pcVar40;
                        cVar4 = pcVar40[1];
                        cVar5 = pcVar40[2];
                        *(short *)((long)&local_198.data + lVar18 * 2) = cVar3 * 2;
                        *(short *)((long)&local_198.data + lVar18 * 2 + 6) =
                             (short)cVar4 + (short)cVar3 + (short)cVar5;
                        *(short *)((long)&local_198.refcount + lVar18 * 2 + 4) =
                             ((short)cVar3 - (short)cVar4) + (short)cVar5;
                        *(short *)((long)&local_198.elemsize + lVar18 * 2 + 2) =
                             (short)cVar5 + (short)cVar5;
                        pcVar40 = pcVar40 + 3;
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 3);
                      lVar18 = 4;
                      do {
                        sVar6 = *(short *)((long)&local_19c + lVar18);
                        sVar7 = *(short *)((long)&local_19c + lVar18 + 2);
                        sVar8 = *(short *)((long)&local_198.data + lVar18);
                        *(short *)&pMVar26->data = sVar6 * 2;
                        *(short *)((long)&pMVar26->data + 2) = sVar7 + sVar6 + sVar8;
                        *(short *)((long)&pMVar26->data + 4) = (sVar6 - sVar7) + sVar8;
                        *(short *)((long)&pMVar26->data + 6) = sVar8 * 2;
                        pMVar26 = (Mat *)&pMVar26->refcount;
                        lVar18 = lVar18 + 6;
                      } while (lVar18 != 0x1c);
                      uVar50 = uVar50 + 1;
                    } while (uVar50 != uVar48);
                  }
                  uVar22 = uVar22 + 1;
                } while (uVar22 != uVar45);
              }
              local_198.w = (this->weight_winograd23_data).w;
              local_198.elemsize = (this->weight_winograd23_data).elemsize;
              local_198.h = (this->weight_winograd23_data).h;
              local_198.elempack = (this->weight_winograd23_data).elempack;
              local_198.allocator = (this->weight_winograd23_data).allocator;
              local_198.cstep = (long)local_198.h * (long)local_198.w;
              local_198.data =
                   (void *)((long)(this->weight_winograd23_data).data +
                           local_198.elemsize * local_198.cstep *
                           (long)(int)((long)((ulong)(uint)((int)uVar43 >> 0x1f) << 0x20 |
                                             uVar43 & 0xffffffff) / (long)(int)local_1a8) +
                           (this->weight_winograd23_data).cstep * local_1e8 * local_198.elemsize);
              local_198.refcount = (int *)0x0;
              local_198.dims = 2;
              local_198.d = 1;
              local_198.c = 1;
              pack_A_tile_int8(pMVar17,&local_198,0x10,(int)uVar45,(int)uVar48);
              uVar43 = (long)&pMVar51->data + uVar43;
              pMVar26 = pMVar51;
            } while ((long)uVar43 < (long)local_1b8);
          }
          local_1e8 = local_1e8 + 1;
        } while (local_1e8 != local_1b0);
      }
      piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar10 == (int *)0x0) goto LAB_00208d5f;
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 != 0) goto LAB_00208d5f;
      if (local_f8.allocator != (Allocator *)0x0) {
        (*(local_f8.allocator)->_vptr_Allocator[3])();
        goto LAB_00208d5f;
      }
    }
  }
  else {
    local_130 = (long)(int)uVar29;
    if (opt->use_sgemm_convolution != true) {
      pMVar51 = &this->weight_data_tm;
      iVar14 = cpu_support_x86_avx2();
      if (iVar14 != 0) {
        convolution_transform_kernel_packed_int8_avx2
                  (local_140,pMVar51,local_200,uVar29,kernel_w,kernel_h);
        goto LAB_00208d5f;
      }
      local_1b0 = (ulong)(int)uVar31;
      if ((int)uVar29 < 4) {
        uVar32 = local_200;
        if ((int)(uint)local_130 < 2) {
          uVar37 = uVar29;
          if ((int)local_200 < 8) {
            if (1 < (int)local_200) {
              uVar32 = local_200 - (int)(uVar43 >> 1);
              uVar37 = (uint)local_130;
              goto LAB_002086a5;
            }
            sVar33 = 1;
            iVar14 = 1;
          }
          else {
            sVar33 = 8;
            iVar14 = 8;
            uVar32 = (local_200 & 1) + (int)(uVar43 >> 3) + ((uint)(uVar43 >> 1) & 3);
          }
        }
        else if ((int)local_200 < 8) {
          if ((int)local_200 < 2) {
            uVar37 = (uVar29 & 1) + 1;
LAB_002086a5:
            sVar33 = 2;
            iVar14 = 2;
          }
          else {
            sVar33 = 4;
            iVar14 = 4;
            uVar32 = local_200 - (int)(uVar43 >> 1);
            uVar37 = (uVar29 & 1) + 1;
          }
        }
        else {
          sVar33 = 0x10;
          iVar14 = 0x10;
          uVar32 = (local_200 & 1) + (int)(uVar43 >> 3) + ((uint)(uVar43 >> 1) & 3);
          uVar37 = ((uint)local_130 & 1) + 1;
        }
        Mat::create(pMVar51,uVar31,uVar32,uVar37,sVar33,iVar14,(Allocator *)0x0);
        uVar43 = 0;
      }
      else {
        if ((int)local_200 < 8) {
          if ((int)local_200 < 2) {
            iVar14 = (uVar29 & 1) + (uVar29 >> 2) + (uint)((uVar29 >> 1 & 1) != 0);
            sVar33 = 4;
            iVar21 = 4;
            uVar32 = local_200;
          }
          else {
            iVar14 = (uVar29 & 1) + ((uint)(local_130 >> 2) & 0x3fffffff) +
                     (uint)((uVar29 >> 1 & 1) != 0);
            sVar33 = 8;
            iVar21 = 8;
            uVar32 = local_200 - (int)(uVar43 >> 1);
          }
        }
        else {
          iVar14 = (uVar29 & 1) + (uVar29 >> 2) + (uint)(((uint)local_130 >> 1 & 1) != 0);
          sVar33 = 0x20;
          iVar21 = 0x20;
          uVar32 = (local_200 & 1) + (int)(uVar43 >> 3) + ((uint)(uVar43 >> 1) & 3);
        }
        Mat::create(pMVar51,uVar31,uVar32,iVar14,sVar33,iVar21,(Allocator *)0x0);
        iVar15 = local_200 * uVar31;
        lVar18 = (long)(int)(uVar31 * 2);
        local_138 = (ulong)(int)(uVar31 * 8);
        local_a0 = CONCAT44(local_a0._4_4_,local_200) & 0xfffffffffffffff8;
        iVar21 = local_200 * uVar31;
        iVar14 = iVar21 * 4;
        local_b0 = CONCAT44(local_b0._4_4_,iVar14);
        local_120 = CONCAT44(local_120._4_4_,iVar21 * 3);
        iVar21 = iVar21 * 2;
        local_a8 = CONCAT44(local_a8._4_4_,iVar15);
        uVar50 = 0;
        uVar43 = 0;
        iVar28 = iVar15;
        do {
          local_118 = uVar43;
          local_108 = uVar50;
          pvVar38 = (this->super_Convolution).weight_data.data;
          uVar32 = (uint)local_118;
          local_1e0 = (long)(int)(iVar15 * uVar32) + (long)pvVar38;
          uVar43 = (long)(int)((uVar32 | 1) * iVar15) + (long)pvVar38;
          local_1d0 = (long)(int)((uVar32 | 2) * iVar15) + (long)pvVar38;
          local_1e8 = (long)(int)((uVar32 | 3) * iVar15) + (long)pvVar38;
          puVar19 = (undefined1 *)
                    ((local_118 >> 2) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          local_128 = CONCAT44(local_128._4_4_,iVar21);
          local_110 = CONCAT44(local_110._4_4_,iVar28);
          iVar25 = (int)local_108;
          if ((int)local_200 < 8) {
            uVar50 = 0;
          }
          else {
            uVar50 = 0;
            pMVar51 = (Mat *)0x0;
            do {
              local_1a8 = pMVar51;
              local_1b8 = uVar50;
              if (0 < (int)uVar31) {
                uVar50 = 0;
                pMVar51 = local_1a8;
                do {
                  puVar20 = puVar19;
                  lVar30 = 0;
                  pMVar17 = pMVar51;
                  do {
                    puVar20[lVar30] =
                         *(undefined1 *)((long)&pMVar17->data + (long)iVar25 + (long)pvVar38);
                    puVar20[lVar30 + 1] =
                         *(undefined1 *)
                          ((long)&pMVar17->data + (long)pvVar38 + (long)iVar25 + local_1b0);
                    puVar20[lVar30 + 2] =
                         *(undefined1 *)((long)&pMVar17->data + (long)iVar28 + (long)pvVar38);
                    puVar20[lVar30 + 3] =
                         *(undefined1 *)
                          ((long)&pMVar17->data + (long)pvVar38 + (long)iVar28 + local_1b0);
                    puVar20[lVar30 + 4] =
                         *(undefined1 *)((long)&pMVar17->data + (long)iVar21 + (long)pvVar38);
                    puVar20[lVar30 + 5] =
                         *(undefined1 *)
                          ((long)&pMVar17->data + (long)pvVar38 + (long)iVar21 + local_1b0);
                    puVar20[lVar30 + 6] =
                         *(undefined1 *)
                          ((long)&pMVar17->data + (long)pvVar38 + (long)(int)local_120);
                    puVar20[lVar30 + 7] =
                         *(undefined1 *)
                          ((long)&pMVar17->data + (long)pvVar38 + (long)(int)local_120 + local_1b0);
                    lVar30 = lVar30 + 8;
                    pMVar17 = (Mat *)((long)&pMVar17->data + lVar18);
                  } while ((int)lVar30 != 0x20);
                  uVar50 = uVar50 + 1;
                  pMVar51 = (Mat *)((long)&pMVar51->data + 1);
                  puVar19 = puVar20 + lVar30;
                } while (uVar50 != uVar22);
                puVar19 = puVar20 + lVar30;
                local_1c0 = uVar43;
              }
              local_1e0 = local_1e0 + local_138;
              uVar43 = uVar43 + local_138;
              local_1d0 = local_1d0 + local_138;
              local_1e8 = local_1e8 + local_138;
              uVar32 = (int)local_1b8 + 8;
              local_1c0 = CONCAT44(local_1c0._4_4_,uVar32);
              uVar50 = (ulong)uVar32;
              pMVar51 = (Mat *)((long)&local_1a8->data + local_138);
            } while ((int)local_1b8 + 0xf < (int)local_200);
            uVar50 = uVar45 & 0xfffffff8;
          }
          uVar32 = (uint)uVar50;
          if ((int)(uVar32 | 1) < (int)local_200) {
            lVar30 = local_1e8 + local_1b0;
            lVar27 = local_1d0 + local_1b0;
            lVar41 = uVar43 + local_1b0;
            lVar24 = local_1e0 + local_1b0;
            do {
              if (0 < (int)uVar31) {
                uVar35 = 0;
                puVar20 = puVar19;
                do {
                  puVar36 = puVar20;
                  puVar20 = puVar19 + uVar35 * 8;
                  *puVar20 = *(undefined1 *)(local_1e0 + uVar35);
                  puVar20[1] = *(undefined1 *)(lVar24 + uVar35);
                  puVar20[2] = *(undefined1 *)(uVar43 + uVar35);
                  puVar20[3] = *(undefined1 *)(lVar41 + uVar35);
                  puVar20[4] = *(undefined1 *)(local_1d0 + uVar35);
                  puVar20[5] = *(undefined1 *)(lVar27 + uVar35);
                  puVar20[6] = *(undefined1 *)(local_1e8 + uVar35);
                  puVar20[7] = *(undefined1 *)(lVar30 + uVar35);
                  uVar35 = uVar35 + 1;
                  puVar20 = puVar20 + 8;
                } while (uVar22 != uVar35);
                puVar19 = puVar36 + 8;
              }
              local_1e0 = local_1e0 + lVar18;
              uVar43 = uVar43 + lVar18;
              local_1d0 = local_1d0 + lVar18;
              local_1e8 = local_1e8 + lVar18;
              iVar47 = (int)uVar50;
              uVar32 = iVar47 + 2;
              lVar30 = lVar30 + lVar18;
              lVar27 = lVar27 + lVar18;
              lVar41 = lVar41 + lVar18;
              lVar24 = lVar24 + lVar18;
              uVar50 = (ulong)uVar32;
            } while (iVar47 + 3 < (int)local_200);
          }
          if ((int)uVar32 < (int)local_200) {
            do {
              if (0 < (int)uVar31) {
                uVar50 = 0;
                do {
                  *puVar19 = *(undefined1 *)(local_1e0 + uVar50);
                  puVar19[1] = *(undefined1 *)(uVar43 + uVar50);
                  puVar19[2] = *(undefined1 *)(local_1d0 + uVar50);
                  puVar19[3] = *(undefined1 *)(local_1e8 + uVar50);
                  puVar19 = puVar19 + 4;
                  uVar50 = uVar50 + 1;
                } while (uVar22 != uVar50);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != local_200);
          }
          uVar43 = local_118 + 4;
          iVar28 = iVar28 + iVar14;
          iVar21 = iVar21 + iVar14;
          local_120 = CONCAT44(local_120._4_4_,(int)local_120 + iVar14);
          uVar50 = (ulong)(uint)(iVar25 + iVar14);
        } while (local_118 + 7 < uVar48);
      }
      uVar37 = (uint)uVar43;
      uVar32 = uVar37 | 1;
      if ((int)uVar32 < (int)uVar29) {
        uVar23 = local_200 * uVar31;
        local_50 = (ulong)uVar23;
        local_58 = (long)(int)(uVar31 * 2);
        local_60 = (long)(int)(uVar31 * 3);
        local_68 = (long)(int)(uVar31 * 4);
        local_70 = (long)(int)(uVar31 * 5);
        local_78 = (long)(int)(uVar31 * 6);
        local_38 = (long)(int)(uVar31 * 8);
        local_80 = (long)(int)(uVar31 * 7);
        local_94 = local_200 & 0xfffffff8;
        local_90 = uVar23 * 2;
        uVar37 = uVar37 * uVar23;
        uVar45 = uVar43 & 0xffffffff;
        iVar14 = uVar23 * uVar32;
        do {
          local_8c = iVar14;
          local_40 = uVar45;
          pvVar38 = (this->super_Convolution).weight_data.data;
          uVar45 = (long)(int)(uVar23 * (uint)local_40) + (long)pvVar38;
          lVar18 = (long)(int)(uVar32 * uVar23) + (long)pvVar38;
          puVar19 = (undefined1 *)
                    ((ulong)(((uint)(local_40 >> 2) & 0x3fffffff) +
                            (uint)(((uint)local_40 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                     (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
          if ((int)local_200 < 8) {
            uVar32 = 0;
          }
          else {
            lVar42 = (long)local_8c;
            lVar49 = (long)(int)uVar37;
            local_110 = (long)pvVar38 + lVar42 + local_80;
            lVar30 = (long)pvVar38 + lVar42 + local_78;
            local_118 = (long)pvVar38 + lVar42 + local_70;
            local_1c0 = (long)pvVar38 + lVar42 + local_68;
            local_108 = (long)pvVar38 + lVar42 + local_1b0;
            lVar46 = (long)pvVar38 + lVar49 + local_80;
            lVar34 = (long)pvVar38 + lVar49 + local_78;
            lVar44 = (long)pvVar38 + lVar49 + local_1b0;
            lVar41 = (long)pvVar38 + lVar49 + local_60;
            lVar24 = (long)pvVar38 + lVar42 + local_58;
            lVar27 = (long)pvVar38 + lVar49 + local_58;
            pMVar51 = (Mat *)((long)pvVar38 + lVar49 + local_70);
            uVar43 = 0;
            lVar42 = (long)pvVar38 + lVar42 + local_60;
            uVar50 = (long)pvVar38 + lVar49 + local_68;
            local_138 = uVar45;
            local_128 = lVar18;
            do {
              local_1b8 = uVar50;
              local_88 = lVar42;
              local_a0 = uVar43;
              local_1a8 = pMVar51;
              local_a8 = lVar27;
              local_b0 = lVar24;
              local_120 = lVar41;
              if (0 < (int)uVar31) {
                uVar45 = 0;
                do {
                  *puVar19 = *(undefined1 *)(local_138 + uVar45);
                  puVar19[1] = *(undefined1 *)(lVar44 + uVar45);
                  puVar19[2] = *(undefined1 *)(local_a8 + uVar45);
                  puVar19[3] = *(undefined1 *)(local_120 + uVar45);
                  puVar19[4] = *(undefined1 *)(local_1b8 + uVar45);
                  puVar19[5] = *(undefined1 *)((long)&local_1a8->data + uVar45);
                  puVar19[6] = *(undefined1 *)(lVar34 + uVar45);
                  puVar19[7] = *(undefined1 *)(lVar46 + uVar45);
                  puVar19[8] = *(undefined1 *)(local_128 + uVar45);
                  puVar19[9] = *(undefined1 *)(local_108 + uVar45);
                  puVar19[10] = *(undefined1 *)(local_b0 + uVar45);
                  puVar19[0xb] = *(undefined1 *)(local_88 + uVar45);
                  puVar19[0xc] = *(undefined1 *)(local_1c0 + uVar45);
                  puVar19[0xd] = *(undefined1 *)(local_118 + uVar45);
                  puVar19[0xe] = *(undefined1 *)(lVar30 + uVar45);
                  puVar19[0xf] = *(undefined1 *)(local_110 + uVar45);
                  puVar19 = puVar19 + 0x10;
                  uVar45 = uVar45 + 1;
                } while (uVar22 != uVar45);
              }
              uVar45 = local_138 + local_38;
              lVar18 = local_128 + local_38;
              local_110 = local_110 + local_38;
              lVar30 = lVar30 + local_38;
              local_118 = local_118 + local_38;
              local_1c0 = local_1c0 + local_38;
              local_108 = local_108 + local_38;
              lVar46 = lVar46 + local_38;
              lVar34 = lVar34 + local_38;
              lVar44 = lVar44 + local_38;
              lVar41 = local_120 + local_38;
              lVar24 = local_b0 + local_38;
              lVar27 = local_a8 + local_38;
              pMVar51 = (Mat *)((long)&local_1a8->data + local_38);
              uVar43 = (ulong)((int)local_a0 + 8);
              lVar42 = local_88 + local_38;
              uVar50 = local_1b8 + local_38;
              uVar32 = local_94;
              local_138 = uVar45;
              local_128 = lVar18;
              local_48 = (ulong)uVar37;
            } while ((int)local_a0 + 0xf < (int)local_200);
          }
          if ((int)(uVar32 | 1) < (int)local_200) {
            lVar30 = lVar18 + local_1b0;
            lVar41 = local_1b0 + uVar45;
            uVar16 = uVar32;
            do {
              if (0 < (int)uVar31) {
                uVar43 = 0;
                do {
                  *puVar19 = *(undefined1 *)(uVar45 + uVar43);
                  puVar19[1] = *(undefined1 *)(lVar18 + uVar43);
                  puVar19[2] = *(undefined1 *)(lVar41 + uVar43);
                  puVar19[3] = *(undefined1 *)(lVar30 + uVar43);
                  puVar19 = puVar19 + 4;
                  uVar43 = uVar43 + 1;
                } while (uVar22 != uVar43);
              }
              uVar45 = uVar45 + local_58;
              lVar18 = lVar18 + local_58;
              uVar32 = uVar16 + 2;
              iVar14 = uVar16 + 3;
              lVar30 = lVar30 + local_58;
              lVar41 = lVar41 + local_58;
              uVar16 = uVar32;
            } while (iVar14 < (int)local_200);
          }
          if ((int)uVar32 < (int)local_200) {
            do {
              if (0 < (int)uVar31) {
                uVar43 = 0;
                do {
                  *puVar19 = *(undefined1 *)(uVar45 + uVar43);
                  puVar19[1] = *(undefined1 *)(lVar18 + uVar43);
                  puVar19 = puVar19 + 2;
                  uVar43 = uVar43 + 1;
                } while (uVar22 != uVar43);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != local_200);
          }
          uVar32 = (uint)(local_40 + 3);
          uVar37 = uVar37 + local_90;
          uVar45 = local_40 + 2;
          iVar14 = local_8c + local_90;
        } while ((long)(local_40 + 3) < (long)local_130);
        uVar37 = (uint)(local_40 + 2);
      }
      if ((int)uVar37 < (int)uVar29) {
        uVar45 = (ulong)uVar37;
        do {
          uVar29 = (uint)uVar45;
          lVar18 = (long)(int)(local_200 * uVar31 * uVar29) +
                   (long)(this->super_Convolution).weight_data.data;
          puVar19 = (undefined1 *)
                    ((this->weight_data_tm).elemsize * (this->weight_data_tm).cstep *
                     (ulong)((uVar29 & 1) + ((uint)(uVar45 >> 2) & 0x3fffffff) +
                            (uint)((uVar29 >> 1 & 1) != 0)) + (long)(this->weight_data_tm).data);
          uVar29 = 0;
          uVar32 = 0;
          if (7 < (int)local_200) {
            do {
              if (0 < (int)uVar31) {
                uVar43 = 0;
                do {
                  puVar20 = puVar19;
                  puVar19 = (undefined1 *)(lVar18 + uVar43);
                  lVar30 = 0;
                  do {
                    puVar20[lVar30] = *puVar19;
                    puVar19 = puVar19 + local_1b0;
                    lVar30 = lVar30 + 1;
                  } while ((int)lVar30 != 8);
                  uVar43 = uVar43 + 1;
                  puVar19 = puVar20 + lVar30;
                } while (uVar43 != uVar22);
                puVar19 = puVar20 + lVar30;
              }
              lVar18 = lVar18 + (int)(uVar31 * 8);
              iVar14 = uVar29 + 0xf;
              uVar29 = uVar29 + 8;
              uVar32 = local_200 & 0xfffffff8;
            } while (iVar14 < (int)local_200);
          }
          if ((int)(uVar32 | 1) < (int)local_200) {
            lVar30 = lVar18 + local_1b0;
            uVar29 = uVar32;
            do {
              if (0 < (int)uVar31) {
                uVar43 = 0;
                do {
                  *puVar19 = *(undefined1 *)(lVar18 + uVar43);
                  puVar19[1] = *(undefined1 *)(lVar30 + uVar43);
                  puVar19 = puVar19 + 2;
                  uVar43 = uVar43 + 1;
                } while (uVar22 != uVar43);
              }
              lVar18 = lVar18 + (int)(uVar31 * 2);
              uVar32 = uVar29 + 2;
              iVar14 = uVar29 + 3;
              lVar30 = lVar30 + (int)(uVar31 * 2);
              uVar29 = uVar32;
            } while (iVar14 < (int)local_200);
          }
          if ((int)uVar32 < (int)local_200) {
            do {
              if (0 < (int)uVar31) {
                uVar43 = 0;
                do {
                  puVar19[uVar43] = *(undefined1 *)(lVar18 + uVar43);
                  uVar43 = uVar43 + 1;
                } while (uVar22 != uVar43);
                puVar19 = puVar19 + uVar43;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != local_200);
          }
          uVar45 = uVar45 + 1;
        } while (uVar45 != uVar48);
      }
      goto LAB_00208d5f;
    }
    iVar21 = local_200 * uVar31;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar29,0,iVar21,(int *)&local_1c4,&local_fc,&local_19c,opt->num_threads);
    iVar14 = (int)(local_1c4 + uVar29 + -1) / (int)local_1c4;
    uVar32 = 8;
    if (opt->use_packing_layout == false) {
      uVar32 = 1;
    }
    if ((uVar45 & 7) != 0) {
      uVar32 = 1;
    }
    local_f8.cstep = 0;
    local_f8.data = (void *)0x0;
    local_f8.refcount._0_4_ = 0;
    local_f8.refcount._4_4_ = 0;
    local_f8.elemsize = 0;
    local_f8.elempack = 0;
    local_f8.allocator = (Allocator *)0x0;
    local_f8.dims = 0;
    local_f8.w = 0;
    local_f8.h = 0;
    local_f8.d = 0;
    local_f8.c = 0;
    if (uVar31 == 1) {
      Mat::reshape(&local_198,local_140,iVar21,uVar29,(Allocator *)0x0);
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + 1;
        UNLOCK();
      }
      piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_f8.allocator == (Allocator *)0x0) {
            if (local_f8.data != (void *)0x0) {
              free(local_f8.data);
            }
          }
          else {
            (*(local_f8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_f8.data = local_198.data;
      local_f8.refcount._0_4_ = SUB84(local_198.refcount,0);
      local_f8.refcount._4_4_ = (undefined4)((ulong)local_198.refcount >> 0x20);
      local_f8.elemsize = local_198.elemsize;
      local_f8.elempack = local_198.elempack;
      local_f8.allocator = local_198.allocator;
      local_f8.d = local_198.d;
      local_f8.h = local_198.h;
      local_f8.dims = local_198.dims;
      local_f8.w = local_198.w;
      local_f8.c = local_198.c;
      local_f8.cstep = local_198.cstep;
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + -1;
        UNLOCK();
        if (*local_198.refcount == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
LAB_00207f38:
            if (local_198.data != (void *)0x0) {
              free(local_198.data);
            }
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::reshape(&local_198,local_140,uVar31,local_200,uVar29,(Allocator *)0x0);
      iVar28 = (int)local_130;
      Mat::create(&local_f8,iVar21,iVar28,1,1,(Allocator *)0x0);
      if (0 < iVar28) {
        uVar45 = 0;
        do {
          if ((int)uVar32 <= (int)local_200) {
            pvVar38 = (void *)((long)local_f8.w * uVar45 * local_f8.elemsize + (long)local_f8.data);
            lVar18 = 0;
            do {
              if (0 < (int)uVar31) {
                uVar43 = 0;
                do {
                  pvVar39 = pvVar38;
                  uVar50 = 0;
                  do {
                    *(undefined1 *)((long)pvVar39 + uVar50) =
                         *(undefined1 *)
                          ((long)local_198.data +
                          uVar43 + (lVar18 + uVar50) * (long)local_198.w * local_198.elemsize +
                                   local_198.cstep * uVar45 * local_198.elemsize);
                    uVar50 = uVar50 + 1;
                  } while (uVar32 != uVar50);
                  uVar43 = uVar43 + 1;
                  pvVar38 = (void *)((long)pvVar39 + uVar50);
                } while (uVar43 != uVar22);
                pvVar38 = (void *)((long)pvVar39 + uVar50);
              }
              lVar18 = lVar18 + (ulong)uVar32;
            } while (lVar18 < (long)((long)(int)local_200 - (ulong)(uVar32 - 1)));
          }
          uVar45 = uVar45 + 1;
        } while (uVar45 != uVar48);
      }
      if (local_198.refcount != (int *)0x0) {
        LOCK();
        *local_198.refcount = *local_198.refcount + -1;
        UNLOCK();
        if (*local_198.refcount == 0) {
          if (local_198.allocator == (Allocator *)0x0) goto LAB_00207f38;
          (*(local_198.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar28 = local_19c;
    if (local_19c < 4) {
LAB_00207ffb:
      Mat::create(&this->weight_sgemm_data,local_1c4 * iVar28,(iVar28 + iVar21 + -1) / iVar28,
                  (int)((uVar29 - 1) + local_1c4) / (int)local_1c4,1,1,(Allocator *)0x0);
    }
    else {
      iVar15 = cpu_support_x86_avx512_vnni();
      bVar13 = true;
      if (iVar15 == 0) {
        iVar15 = cpu_support_x86_avx_vnni();
        bVar13 = iVar15 != 0;
      }
      iVar15 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar13 & iVar15 == 0)) goto LAB_00207ffb;
      iVar15 = 0x40;
      if ((((int)local_1c4 < 0x10) && (iVar15 = 0x20, (int)local_1c4 < 8)) &&
         (iVar15 = 0x10, (int)local_1c4 < 4)) {
        iVar15 = (uint)(1 < (int)local_1c4) * 4 + 4;
      }
      Mat::create(&this->weight_sgemm_data,(iVar15 + iVar28) * local_1c4,
                  (iVar28 + iVar21 + -1) / iVar28,(int)((uVar29 - 1) + local_1c4) / (int)local_1c4,1
                  ,1,(Allocator *)0x0);
    }
    if (0 < iVar14) {
      iVar15 = 0;
      do {
        iVar25 = local_1c4 * iVar15;
        uVar31 = uVar29 - iVar25;
        if ((int)local_1c4 < (int)(uVar29 - iVar25)) {
          uVar31 = local_1c4;
        }
        if (0 < iVar21) {
          iVar47 = 0;
          do {
            max_kk = iVar21 - iVar47;
            if (iVar28 < iVar21 - iVar47) {
              max_kk = iVar28;
            }
            local_198.w = (this->weight_sgemm_data).w;
            local_198.cstep = (size_t)local_198.w;
            local_198.elemsize = (this->weight_sgemm_data).elemsize;
            local_198.elempack = (this->weight_sgemm_data).elempack;
            local_198.allocator = (this->weight_sgemm_data).allocator;
            local_198.data =
                 (void *)((long)(this->weight_sgemm_data).data +
                         local_198.elemsize * local_198.cstep * (long)(iVar47 / iVar28) +
                         (long)(iVar25 / (int)local_1c4) * (this->weight_sgemm_data).cstep *
                         local_198.elemsize);
            local_198.refcount = (int *)0x0;
            local_198.dims = 2;
            local_198.h = 1;
            local_198.d = 1;
            local_198.c = 1;
            Gemm_x86_avx_utility::pack_A_tile_int8(&local_f8,&local_198,iVar25,uVar31,iVar47,max_kk)
            ;
            if (local_198.refcount != (int *)0x0) {
              LOCK();
              *local_198.refcount = *local_198.refcount + -1;
              UNLOCK();
              if (*local_198.refcount == 0) {
                if (local_198.allocator == (Allocator *)0x0) {
                  if (local_198.data != (void *)0x0) {
                    free(local_198.data);
                  }
                }
                else {
                  (*(local_198.allocator)->_vptr_Allocator[3])();
                }
              }
            }
            iVar47 = iVar47 + local_19c;
            iVar28 = local_19c;
          } while (iVar47 < iVar21);
        }
        iVar15 = iVar15 + 1;
      } while (iVar15 != iVar14);
    }
    piVar10 = (int *)CONCAT44(local_f8.refcount._4_4_,local_f8.refcount._0_4_);
    if (piVar10 == (int *)0x0) goto LAB_00208d5f;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_00208d5f;
    if (local_f8.allocator != (Allocator *)0x0) {
      (*(local_f8.allocator)->_vptr_Allocator[3])();
      goto LAB_00208d5f;
    }
  }
  if (local_f8.data != (void *)0x0) {
    free(local_f8.data);
  }
LAB_00208d5f:
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  lVar18 = (long)(this->super_Convolution).num_output;
  if (0 < lVar18) {
    pvVar38 = (this->super_Convolution).weight_data_int8_scales.data;
    pfVar9 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
    pvVar39 = (this->scale_in_data).data;
    lVar30 = 0;
    do {
      fVar1 = *(float *)((long)pvVar38 + lVar30 * 4);
      fVar53 = 0.0;
      if (fVar1 != 0.0) {
        fVar53 = 1.0 / (fVar1 * *pfVar9);
      }
      *(float *)((long)pvVar39 + lVar30 * 4) = fVar53;
      lVar30 = lVar30 + 1;
    } while (lVar18 != lVar30);
  }
  if (local_148->lightmode != false) {
    piVar10 = (this->super_Convolution).weight_data.refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if (*piVar10 == 0) {
        pvVar38 = (this->super_Convolution).weight_data.data;
        pAVar11 = (this->super_Convolution).weight_data.allocator;
        if (pAVar11 == (Allocator *)0x0) {
          if (pvVar38 != (void *)0x0) {
            free(pvVar38);
          }
        }
        else {
          (*pAVar11->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined1 (*) [16])((long)&local_140->refcount + 4) = (undefined1  [16])0x0;
    local_140->data = (void *)0x0;
    local_140->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_avx::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}